

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

void do_zz_fp(DisasContext_conflict1 *s,arg_rr_esz *a,undefined1 *fn)

{
  uint32_t oprsz;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_ptr ptr;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  oprsz = s->sve_len;
  ptr = get_fpstatus_ptr_aarch64(tcg_ctx,a->esz == 1);
  tcg_gen_gvec_2_ptr_aarch64
            (tcg_ctx,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,ptr,oprsz,oprsz,0,fn);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ptr + (long)tcg_ctx));
  return;
}

Assistant:

static void do_zz_fp(DisasContext *s, arg_rr_esz *a, gen_helper_gvec_2_ptr *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned vsz = vec_full_reg_size(s);
    TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);

    tcg_gen_gvec_2_ptr(tcg_ctx, vec_full_reg_offset(s, a->rd),
                       vec_full_reg_offset(s, a->rn),
                       status, vsz, vsz, 0, fn);
    tcg_temp_free_ptr(tcg_ctx, status);
}